

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_decode_memory(uint8 *mem,int len,int *channels,int *sample_rate,short **output)

{
  int iVar1;
  stb_vorbis *buffer;
  void *pvVar2;
  uint *in_RCX;
  int *in_RDX;
  undefined8 *in_R8;
  short *data2;
  int n;
  stb_vorbis *v;
  short *data;
  int error;
  int limit;
  int total;
  int offset;
  int data_len;
  stb_vorbis_alloc *in_stack_00000710;
  int *in_stack_00000718;
  int in_stack_00000724;
  uchar *in_stack_00000728;
  int in_stack_ffffffffffffffa4;
  void *__ptr;
  stb_vorbis *in_stack_ffffffffffffffb8;
  int local_3c;
  int local_38;
  int local_34;
  int local_4;
  
  buffer = stb_vorbis_open_memory
                     (in_stack_00000728,in_stack_00000724,in_stack_00000718,in_stack_00000710);
  if (buffer == (stb_vorbis *)0x0) {
    local_4 = -1;
  }
  else {
    iVar1 = buffer->channels * 0x1000;
    *in_RDX = buffer->channels;
    if (in_RCX != (uint *)0x0) {
      *in_RCX = buffer->sample_rate;
    }
    local_34 = 0;
    local_38 = 0;
    pvVar2 = malloc((long)iVar1 << 1);
    local_3c = iVar1;
    if (pvVar2 == (void *)0x0) {
      stb_vorbis_close((stb_vorbis *)0x261f0d);
      local_4 = -2;
    }
    else {
      do {
        do {
          __ptr = pvVar2;
          in_stack_ffffffffffffffa4 =
               stb_vorbis_get_frame_short_interleaved
                         (in_stack_ffffffffffffffb8,(int)((ulong)__ptr >> 0x20),(short *)buffer,
                          in_stack_ffffffffffffffa4);
          if (in_stack_ffffffffffffffa4 == 0) {
            *in_R8 = __ptr;
            stb_vorbis_close((stb_vorbis *)0x261fef);
            return local_34;
          }
          local_34 = in_stack_ffffffffffffffa4 + local_34;
          local_38 = in_stack_ffffffffffffffa4 * buffer->channels + local_38;
          pvVar2 = __ptr;
        } while (local_38 + iVar1 <= local_3c);
        local_3c = local_3c << 1;
        pvVar2 = realloc(__ptr,(long)local_3c << 1);
      } while (pvVar2 != (void *)0x0);
      free(__ptr);
      stb_vorbis_close((stb_vorbis *)0x261fc0);
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int stb_vorbis_decode_memory(const uint8 *mem, int len, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_memory(mem, len, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}